

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResumeThrow
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ResumeThrow *curr,
          optional<wasm::HeapType> ct)

{
  bool bVar1;
  Tag *pTVar2;
  size_t sVar3;
  Expression **ppEVar4;
  Type *pTVar5;
  size_t i;
  ulong index;
  Signature SVar6;
  Type local_58;
  Type local_50;
  Type params;
  _Storage<wasm::HeapType,_true> local_40;
  optional<wasm::HeapType> ct_local;
  
  local_40 = ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  ct_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (((undefined1  [16])
       ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_40._M_value = wasm::Type::getHeapType(&curr->cont->type);
    ct_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ = 1;
  }
  bVar1 = HeapType::isContinuation(&local_40._M_value);
  if (bVar1) {
    pTVar2 = Module::getTag(this->wasm,(Name)(curr->tag).super_IString.str);
    SVar6 = HeapType::getSignature(&pTVar2->type);
    local_50 = SVar6.params.id;
    sVar3 = wasm::Type::size(&local_50);
    if (sVar3 == (curr->operands).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements) {
      index = 0;
      params.id = (uintptr_t)curr;
      while( true ) {
        sVar3 = wasm::Type::size(&local_50);
        if (sVar3 <= index) break;
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(curr->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,index);
        pTVar5 = wasm::Type::operator[](&local_50,index);
        IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                  ((ConstraintCollector *)this,ppEVar4,(Type)pTVar5->id);
        index = index + 1;
      }
      ppEVar4 = (Expression **)(params.id + 0x80);
      wasm::Type::Type(&local_58,local_40._M_value.id,Nullable,Inexact);
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,ppEVar4,local_58);
      return;
    }
    __assert_fail("params.size() == curr->operands.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x47e,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResumeThrow(ResumeThrow *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  __assert_fail("ct->isContinuation()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x47c,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResumeThrow(ResumeThrow *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitResumeThrow(ResumeThrow* curr,
                        std::optional<HeapType> ct = std::nullopt) {
    if (!ct.has_value()) {
      ct = curr->cont->type.getHeapType();
    }
    assert(ct->isContinuation());
    auto params = wasm.getTag(curr->tag)->params();
    assert(params.size() == curr->operands.size());
    for (size_t i = 0; i < params.size(); ++i) {
      note(&curr->operands[i], params[i]);
    }
    note(&curr->cont, Type(*ct, Nullable));
  }